

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::GenerateGraphViz(cmake *this,string *fileName)

{
  pointer pcVar1;
  string *psVar2;
  string fallbackSettingsFile;
  string settingsFile;
  cmGraphVizWriter gvWriter;
  string local_170;
  string local_150;
  cmGraphVizWriter local_130;
  
  cmGraphVizWriter::cmGraphVizWriter(&local_130,this->GlobalGenerator);
  psVar2 = cmState::GetBinaryDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar1,pcVar1 + psVar2->_M_string_length);
  std::__cxx11::string::append((char *)&local_150);
  psVar2 = cmState::GetSourceDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar1,pcVar1 + psVar2->_M_string_length);
  std::__cxx11::string::append((char *)&local_170);
  cmGraphVizWriter::ReadSettings(&local_130,&local_150,&local_170);
  cmGraphVizWriter::WritePerTargetFiles(&local_130,fileName);
  cmGraphVizWriter::WriteTargetDependersFiles(&local_130,fileName);
  cmGraphVizWriter::WriteGlobalFile(&local_130,fileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  cmGraphVizWriter::~cmGraphVizWriter(&local_130);
  return;
}

Assistant:

void cmake::GenerateGraphViz(const std::string& fileName) const
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmGraphVizWriter gvWriter(this->GetGlobalGenerator());

  std::string settingsFile = this->GetHomeOutputDirectory();
  settingsFile += "/CMakeGraphVizOptions.cmake";
  std::string fallbackSettingsFile = this->GetHomeDirectory();
  fallbackSettingsFile += "/CMakeGraphVizOptions.cmake";

  gvWriter.ReadSettings(settingsFile, fallbackSettingsFile);
  gvWriter.WritePerTargetFiles(fileName);
  gvWriter.WriteTargetDependersFiles(fileName);
  gvWriter.WriteGlobalFile(fileName);

#endif
}